

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Button.cxx
# Opt level: O0

void __thiscall Fl_Button::draw(Fl_Button *this)

{
  uchar uVar1;
  char cVar2;
  Fl_Boxtype FVar3;
  Fl_Labeltype FVar4;
  Fl_Color fg;
  Fl_Color c_00;
  Fl_Button *pFVar5;
  Fl_Boxtype local_2c;
  Fl_Boxtype local_28;
  Fl_Color local_24;
  Fl_Color c;
  Fl_Color col;
  Fl_Button *this_local;
  
  uVar1 = Fl_Widget::type(&this->super_Fl_Widget);
  if (uVar1 != '\x03') {
    cVar2 = value(this);
    if (cVar2 == '\0') {
      local_24 = Fl_Widget::color(&this->super_Fl_Widget);
    }
    else {
      local_24 = Fl_Widget::selection_color(&this->super_Fl_Widget);
    }
    cVar2 = value(this);
    if (cVar2 == '\0') {
      local_2c = Fl_Widget::box(&this->super_Fl_Widget);
    }
    else {
      FVar3 = down_box(this);
      if (FVar3 == FL_NO_BOX) {
        FVar3 = Fl_Widget::box(&this->super_Fl_Widget);
        local_28 = fl_down(FVar3);
      }
      else {
        local_28 = down_box(this);
      }
      local_2c = local_28;
    }
    Fl_Widget::draw_box(&this->super_Fl_Widget,local_2c,local_24);
    Fl_Widget::draw_backdrop(&this->super_Fl_Widget);
    FVar4 = Fl_Widget::labeltype(&this->super_Fl_Widget);
    if ((FVar4 == FL_NORMAL_LABEL) && (cVar2 = value(this), cVar2 != '\0')) {
      fg = Fl_Widget::labelcolor(&this->super_Fl_Widget);
      c_00 = fl_contrast(fg,local_24);
      Fl_Widget::labelcolor(&this->super_Fl_Widget,c_00);
      Fl_Widget::draw_label(&this->super_Fl_Widget);
      Fl_Widget::labelcolor(&this->super_Fl_Widget,fg);
    }
    else {
      Fl_Widget::draw_label(&this->super_Fl_Widget);
    }
    pFVar5 = (Fl_Button *)Fl::focus();
    if (pFVar5 == this) {
      Fl_Widget::draw_focus(&this->super_Fl_Widget);
    }
  }
  return;
}

Assistant:

void Fl_Button::draw() {
  if (type() == FL_HIDDEN_BUTTON) return;
  Fl_Color col = value() ? selection_color() : color();
  draw_box(value() ? (down_box()?down_box():fl_down(box())) : box(), col);
  draw_backdrop();
  if (labeltype() == FL_NORMAL_LABEL && value()) {
    Fl_Color c = labelcolor();
    labelcolor(fl_contrast(c, col));
    draw_label();
    labelcolor(c);
  } else draw_label();
  if (Fl::focus() == this) draw_focus();
}